

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

spv_result_t
spvOpcodeTableValueLookup
          (spv_target_env env,spv_opcode_table table,Op opcode,spv_opcode_desc *pEntry)

{
  uint32_t uVar1;
  spv_result_t sVar2;
  ulong uVar3;
  ulong uVar5;
  spv_opcode_desc psVar6;
  spv_opcode_desc psVar7;
  ulong uVar4;
  
  if (table == (spv_opcode_table)0x0) {
    sVar2 = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_opcode_desc *)0x0) {
    sVar2 = SPV_ERROR_INVALID_POINTER;
  }
  else {
    psVar6 = table->entries;
    uVar4 = (ulong)table->count;
    psVar7 = psVar6 + uVar4;
    uVar1 = spvVersionForTargetEnv(env);
    if (uVar4 != 0) {
      do {
        uVar3 = uVar4 >> 1;
        uVar5 = uVar3;
        if (psVar6[uVar3].opcode < opcode) {
          uVar5 = ~uVar3 + uVar4;
          psVar6 = psVar6 + uVar3 + 1;
        }
        uVar4 = uVar5;
      } while (0 < (long)uVar5);
    }
    while( true ) {
      if (psVar6 == psVar7) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      if (psVar6->opcode != opcode) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      if ((((psVar6->minVersion <= uVar1) && (uVar1 <= psVar6->lastVersion)) ||
          (psVar6->numExtensions != 0)) || (psVar6->numCapabilities != 0)) break;
      psVar6 = psVar6 + 1;
    }
    *pEntry = psVar6;
    sVar2 = SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t spvOpcodeTableValueLookup(spv_target_env env,
                                       const spv_opcode_table table,
                                       const spv::Op opcode,
                                       spv_opcode_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  const auto beg = table->entries;
  const auto end = table->entries + table->count;

  spv_opcode_desc_t needle = {"", opcode, 0,     nullptr, 0,       {},  0,
                              {}, false,  false, 0,       nullptr, ~0u, ~0u};

  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };

  // We need to loop here because there can exist multiple symbols for the same
  // opcode value, and they can be introduced in different target environments,
  // which means they can have different minimal version requirements.
  // Assumes the underlying table is already sorted ascendingly according to
  // opcode value.
  const auto version = spvVersionForTargetEnv(env);
  for (auto it = std::lower_bound(beg, end, needle, comp);
       it != end && it->opcode == opcode; ++it) {
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= it->minVersion && version <= it->lastVersion) ||
        it->numExtensions > 0u || it->numCapabilities > 0u) {
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}